

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_bddVectorCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  int *piVar1;
  uint uVar2;
  DdHashTable *table;
  DdNode *pDVar3;
  uint uVar4;
  uint uVar5;
  uint deepest;
  
  do {
    dd->reordered = 0;
    table = cuddHashTableInit(dd,1,2);
    if (table == (DdHashTable *)0x0) goto LAB_00667ca8;
    uVar4 = dd->size;
    uVar2 = (int)uVar4 >> 0x1f & uVar4;
    uVar5 = uVar4;
    do {
      uVar4 = uVar4 - 1;
      deepest = uVar2 - 1;
      if ((int)uVar5 < 1) break;
      deepest = uVar5 - 1;
      uVar5 = deepest;
    } while (vector[dd->invperm[uVar4]] == dd->vars[dd->invperm[uVar4]]);
    pDVar3 = cuddBddVectorComposeRecur(dd,table,f,vector,deepest);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    cuddHashTableQuit(table);
  } while (dd->reordered == 1);
  if (pDVar3 == (DdNode *)0x0) {
LAB_00667ca8:
    pDVar3 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_bddVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (vector[i] != dd->vars[i]) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddBddVectorComposeRecur(dd,table,f,vector, deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}